

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

bool __thiscall
miniply::PLYReader::load_ascii_scalar_property(PLYReader *this,PLYProperty *prop,size_t *destIndex)

{
  uint uVar1;
  bool bVar2;
  uchar *puVar3;
  size_t numBytes;
  uint8_t value [8];
  size_t *destIndex_local;
  PLYProperty *prop_local;
  PLYReader *this_local;
  
  value = (uint8_t  [8])destIndex;
  bVar2 = ascii_value(this,prop->type,(uint8_t *)&numBytes);
  if (bVar2) {
    uVar1 = *(uint *)(kPLYPropertySize + (ulong)prop->type * 4);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_elementData);
    memcpy(puVar3 + *(long *)value,&numBytes,(ulong)uVar1);
    *(ulong *)value = (ulong)uVar1 + *(long *)value;
  }
  return bVar2;
}

Assistant:

bool PLYReader::load_ascii_scalar_property(PLYProperty& prop, size_t& destIndex)
  {
    uint8_t value[8];
    if (!ascii_value(prop.type, value)) {
      return false;
    }

    size_t numBytes = kPLYPropertySize[uint32_t(prop.type)];
    std::memcpy(m_elementData.data() + destIndex, value, numBytes);
    destIndex += numBytes;
    return true;
  }